

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltools.hh
# Opt level: O2

int anon_unknown.dwarf_f480::getAttribute<int>(xmlNodePtr type,char *att_name)

{
  int iVar1;
  char *in_RCX;
  string sStack_28;
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&sStack_28,(_anonymous_namespace_ *)type,(xmlNodePtr)att_name,in_RCX);
  iVar1 = boost::lexical_cast<int,std::__cxx11::string>(&sStack_28);
  std::__cxx11::string::~string((string *)&sStack_28);
  return iVar1;
}

Assistant:

T getAttribute(xmlNodePtr type, char const* att_name)
    { return boost::lexical_cast<T>(getStringAttribute(type, att_name)); }